

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

size_t nifti_write_buffer(znzFile fp,void *buffer,size_t numbytes)

{
  size_t ss;
  size_t numbytes_local;
  void *buffer_local;
  znzFile fp_local;
  
  if (fp == (znzFile)0x0) {
    fprintf(_stderr,"** ERROR: nifti_write_buffer: null file pointer\n");
    fp_local = (znzFile)0x0;
  }
  else {
    fp_local = (znzFile)znzwrite(buffer,1,numbytes,fp);
  }
  return (size_t)fp_local;
}

Assistant:

size_t nifti_write_buffer(znzFile fp, const void *buffer, size_t numbytes)
{
   /* Write all the image data at once (no swapping here) */
   size_t ss;
   if (znz_isnull(fp)){
      fprintf(stderr,"** ERROR: nifti_write_buffer: null file pointer\n");
      return 0;
   }
   ss = znzwrite( (const void*)buffer , 1 , numbytes , fp ) ;
   return ss;
}